

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_failure_fail_tests.cpp
# Opt level: O3

void __thiscall
iu_NoFailureTest_x_iutest_x_Assert_Test::Body(iu_NoFailureTest_x_iutest_x_Assert_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Variable *pVVar2;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  AssertionHelper local_1c8;
  undefined1 local_198 [16];
  TestPartResultReporterInterface *local_188;
  int local_17c;
  ios_base local_118 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
             *)local_198);
  OccurFatalFailure();
  local_198._8_8_ = &PTR__ReporterHolder_0012c8c8;
  pVVar2 = iutest::TestEnv::get_vars();
  pVVar2->m_testpartresult_reporter = local_188;
  if (local_17c < 1) {
    nCount = nCount + 1;
  }
  else {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    paVar1 = &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2;
    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,
               "\nExpected: OccurFatalFailure() doesn\'t generate new failure.\n  Actual: it does.",
               "");
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_fail_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x26;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
  }
  return;
}

Assistant:

IUTEST(NoFailureTest, Assert)
{
    IUTEST_ASSERT_NO_FAILURE(OccurFatalFailure());
    ++nCount;
}